

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::getSubElement(Value *__return_storage_ptr__,Value *this,SubElementPath *path)

{
  uint8_t *puVar1;
  TypeAndOffset typeAndOffset;
  TypeAndOffset local_58;
  Type local_38;
  
  SubElementPath::getElement(&local_58,path,&this->type);
  local_38.category = local_58.type.category;
  local_38.arrayElementCategory = local_58.type.arrayElementCategory;
  local_38.isRef = local_58.type.isRef;
  local_38.isConstant = local_58.type.isConstant;
  local_38.primitiveType.type = local_58.type.primitiveType.type;
  local_38.boundingSize = local_58.type.boundingSize;
  local_38.arrayElementBoundingSize = local_58.type.arrayElementBoundingSize;
  local_38.structure.object = local_58.type.structure.object;
  local_58.type.structure.object = (Structure *)0x0;
  puVar1 = LazyAllocatedData::data(&this->allocatedData);
  Value(__return_storage_ptr__,&local_38,puVar1 + local_58.offset);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_58.type.structure);
  return __return_storage_ptr__;
}

Assistant:

Value Value::getSubElement (const SubElementPath& path) const
{
    auto typeAndOffset = path.getElement (type);
    return Value (std::move (typeAndOffset.type), allocatedData.data() + typeAndOffset.offset);
}